

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void ZopfliLengthsToSymbols(uint *lengths,size_t n,uint maxbits,uint *symbols)

{
  uint uVar1;
  undefined8 *__ptr;
  void *__ptr_00;
  long in_RCX;
  uint in_EDX;
  ulong in_RSI;
  long in_RDI;
  uint len;
  uint code;
  uint i;
  uint bits;
  size_t *next_code;
  size_t *bl_count;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  __ptr = (undefined8 *)malloc((ulong)(in_EDX + 1) << 3);
  __ptr_00 = malloc((ulong)(in_EDX + 1) << 3);
  for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
    *(undefined4 *)(in_RCX + (ulong)local_38 * 4) = 0;
  }
  for (local_34 = 0; local_34 <= in_EDX; local_34 = local_34 + 1) {
    __ptr[local_34] = 0;
  }
  for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
    uVar1 = *(uint *)(in_RDI + (ulong)local_38 * 4);
    __ptr[uVar1] = __ptr[uVar1] + 1;
  }
  local_3c = 0;
  *__ptr = 0;
  for (local_34 = 1; local_34 <= in_EDX; local_34 = local_34 + 1) {
    local_3c = (local_3c + (int)__ptr[local_34 - 1]) * 2;
    *(ulong *)((long)__ptr_00 + (ulong)local_34 * 8) = (ulong)local_3c;
  }
  for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
    uVar1 = *(uint *)(in_RDI + (ulong)local_38 * 4);
    if (uVar1 != 0) {
      *(int *)(in_RCX + (ulong)local_38 * 4) =
           (int)*(undefined8 *)((long)__ptr_00 + (ulong)uVar1 * 8);
      *(long *)((long)__ptr_00 + (ulong)uVar1 * 8) =
           *(long *)((long)__ptr_00 + (ulong)uVar1 * 8) + 1;
    }
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void ZopfliLengthsToSymbols(const unsigned* lengths, size_t n, unsigned maxbits,
                            unsigned* symbols) {
  size_t* bl_count = (size_t*)malloc(sizeof(size_t) * (maxbits + 1));
  size_t* next_code = (size_t*)malloc(sizeof(size_t) * (maxbits + 1));
  unsigned bits, i;
  unsigned code;

  for (i = 0; i < n; i++) {
    symbols[i] = 0;
  }

  /* 1) Count the number of codes for each code length. Let bl_count[N] be the
  number of codes of length N, N >= 1. */
  for (bits = 0; bits <= maxbits; bits++) {
    bl_count[bits] = 0;
  }
  for (i = 0; i < n; i++) {
    assert(lengths[i] <= maxbits);
    bl_count[lengths[i]]++;
  }
  /* 2) Find the numerical value of the smallest code for each code length. */
  code = 0;
  bl_count[0] = 0;
  for (bits = 1; bits <= maxbits; bits++) {
    code = (code + bl_count[bits-1]) << 1;
    next_code[bits] = code;
  }
  /* 3) Assign numerical values to all codes, using consecutive values for all
  codes of the same length with the base values determined at step 2. */
  for (i = 0;  i < n; i++) {
    unsigned len = lengths[i];
    if (len != 0) {
      symbols[i] = next_code[len];
      next_code[len]++;
    }
  }

  free(bl_count);
  free(next_code);
}